

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

V5_vertical_alignment
ON_INTERNAL_OBSOLETE::V5VerticalAlignmentFromV5Justification(uint v5_justification_bits)

{
  V5_vertical_alignment VVar1;
  
  VVar1 = Top;
  if ((v5_justification_bits & 0x70000) != 0x40000) {
    VVar1 = ((v5_justification_bits & 0x70000) != 0x20000) * '\x02' | Middle;
  }
  return VVar1;
}

Assistant:

ON_INTERNAL_OBSOLETE::V5_vertical_alignment ON_INTERNAL_OBSOLETE::V5VerticalAlignmentFromV5Justification(
    unsigned int v5_justification_bits
  )
{
  ON_INTERNAL_OBSOLETE::V5_vertical_alignment valign = ON_INTERNAL_OBSOLETE::V5_vertical_alignment::Bottom;

  const unsigned int v5_valign_mask
    = ON_OBSOLETE_V5_TextObject::eTextJustification::tjBottom
    | ON_OBSOLETE_V5_TextObject::eTextJustification::tjMiddle
    | ON_OBSOLETE_V5_TextObject::eTextJustification::tjTop;

  if (ON_OBSOLETE_V5_TextObject::eTextJustification::tjTop == (v5_justification_bits & v5_valign_mask))
    valign = ON_INTERNAL_OBSOLETE::V5_vertical_alignment::Top;
  else if (ON_OBSOLETE_V5_TextObject::eTextJustification::tjMiddle == (v5_justification_bits & v5_valign_mask))
    valign = ON_INTERNAL_OBSOLETE::V5_vertical_alignment::Middle;

  return valign;
}